

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::flush_output
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this,int outputs)

{
  HalfCycles cycles;
  long lVar1;
  long lVar2;
  
  if (((outputs & 1U) != 0) && ((this->vdp_).is_flushed_ == false)) {
    (this->vdp_).is_flushed_ = true;
    (this->vdp_).did_flush_ = true;
    cycles.super_WrappedInt<HalfCycles>.length_ =
         (WrappedInt<HalfCycles>)
         (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
    (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    TI::TMS::TMS9918<(TI::TMS::Personality)1>::run_for(&(this->vdp_).object_,cycles);
  }
  if ((outputs & 2U) != 0) {
    lVar1 = (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_;
    lVar2 = lVar1 + 3;
    if (-1 < lVar1) {
      lVar2 = lVar1;
    }
    (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar1 % 4;
    Outputs::Speaker::
    PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
    ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar2 >> 2));
    if ((this->speaker_).audio_queue.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->speaker_).audio_queue.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Video) {
				vdp_.flush();
			}
			if(outputs & Output::Audio) {
				update_audio();
				speaker_.audio_queue.perform();
			}
		}